

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

Symbol * __thiscall SymbolTable::cSearch(SymbolTable *this,char *lexeme)

{
  int iVar1;
  char *pcVar2;
  Symbol *pSVar3;
  int iVar4;
  unsigned_long uVar5;
  Symbol **ppSVar6;
  allocator local_41;
  string local_40;
  
  if (lexeme != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_40,lexeme,&local_41);
    uVar5 = cHash(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    pcVar2 = this->lexemeArray;
    ppSVar6 = (Symbol **)((ulong)(uint)((int)uVar5 << 3) + (long)this->block);
    while (pSVar3 = *ppSVar6, pSVar3 != (Symbol *)0x0) {
      iVar1 = pSVar3->lexemeIndex;
      iVar4 = strcmp(pcVar2 + iVar1,lexeme);
      if (iVar4 == 0) {
        pSVar3->lexeme = pcVar2 + iVar1;
        return pSVar3;
      }
      ppSVar6 = &pSVar3->nextSymbol;
    }
  }
  return (Symbol *)0x0;
}

Assistant:

Symbol *SymbolTable::cSearch(const char *lexeme) {
    if (lexeme != nullptr) {
        unsigned long pos = cHash(lexeme);
        Symbol *temp = block[pos];
        while (temp != nullptr) {

            if (strcmp(lexemeArray + temp->getLexemeIndex(), lexeme) == 0) {
                temp->setLexeme(lexemeArray + temp->getLexemeIndex());
                return temp;
            }
            temp = temp->getNextSymbol();
        }
        return nullptr;
    }
    return nullptr;
}